

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O2

void fill_border(uint8_t *img_buf,int width,int height,int stride)

{
  uint8_t *puVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  uint8_t *puVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  
  lVar4 = (long)stride;
  uVar2 = 0;
  puVar5 = img_buf;
  if (0 < height) {
    uVar2 = (ulong)(uint)height;
  }
  while (bVar6 = uVar2 != 0, uVar2 = uVar2 - 1, bVar6) {
    auVar8 = ZEXT216(CONCAT11(*puVar5,*puVar5));
    auVar8 = pshuflw(auVar8,auVar8,0);
    uVar7 = auVar8._0_4_;
    *(undefined4 *)(puVar5 + -0x10) = uVar7;
    *(undefined4 *)(puVar5 + -0xc) = uVar7;
    *(undefined4 *)(puVar5 + -8) = uVar7;
    *(undefined4 *)(puVar5 + -4) = uVar7;
    auVar8 = ZEXT216(CONCAT11(puVar5[(long)width + -1],puVar5[(long)width + -1]));
    auVar8 = pshuflw(auVar8,auVar8,0);
    uVar7 = auVar8._0_4_;
    puVar1 = puVar5 + width;
    *(undefined4 *)puVar1 = uVar7;
    *(undefined4 *)(puVar1 + 4) = uVar7;
    *(undefined4 *)(puVar1 + 8) = uVar7;
    *(undefined4 *)(puVar1 + 0xc) = uVar7;
    puVar5 = puVar5 + lVar4;
  }
  puVar5 = img_buf + lVar4 * -0x10 + -0x10;
  lVar3 = 0x10;
  while (bVar6 = lVar3 != 0, lVar3 = lVar3 + -1, bVar6) {
    memcpy(puVar5,img_buf + -0x10,(long)(width + 0x20));
    puVar5 = puVar5 + lVar4;
  }
  lVar3 = (long)height;
  puVar5 = img_buf + lVar4 * lVar3 + -0x10;
  for (; lVar3 < height + 0x10; lVar3 = lVar3 + 1) {
    memcpy(puVar5,img_buf + (long)(stride * (height + -1)) + -0x10,(long)(width + 0x20));
    puVar5 = puVar5 + lVar4;
  }
  return;
}

Assistant:

static inline void fill_border(uint8_t *img_buf, const int width,
                               const int height, const int stride) {
  // Fill left and right areas
  for (int row = 0; row < height; row++) {
    uint8_t *row_start = &img_buf[row * stride];
    uint8_t left_pixel = row_start[0];
    memset(row_start - PYRAMID_PADDING, left_pixel, PYRAMID_PADDING);
    uint8_t right_pixel = row_start[width - 1];
    memset(row_start + width, right_pixel, PYRAMID_PADDING);
  }

  // Fill top area
  for (int row = -PYRAMID_PADDING; row < 0; row++) {
    uint8_t *row_start = &img_buf[row * stride];
    memcpy(row_start - PYRAMID_PADDING, img_buf - PYRAMID_PADDING,
           width + 2 * PYRAMID_PADDING);
  }

  // Fill bottom area
  uint8_t *last_row_start = &img_buf[(height - 1) * stride];
  for (int row = height; row < height + PYRAMID_PADDING; row++) {
    uint8_t *row_start = &img_buf[row * stride];
    memcpy(row_start - PYRAMID_PADDING, last_row_start - PYRAMID_PADDING,
           width + 2 * PYRAMID_PADDING);
  }
}